

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::is_out_of_bounds_tessellation_level(CompilerMSL *this,uint32_t id_lhs)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIREntryPoint *pSVar4;
  SPIRExpression *pSVar5;
  TypedID *this_00;
  SPIRConstant *this_01;
  bool local_42;
  SPIRConstant *c;
  BuiltIn builtin;
  SPIRExpression *e;
  uint32_t id_lhs_local;
  CompilerMSL *this_local;
  
  pSVar4 = Compiler::get_entry_point((Compiler *)this);
  bVar1 = Bitset::get(&pSVar4->flags,0x16);
  if (!bVar1) {
    return false;
  }
  pSVar5 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,id_lhs);
  if ((pSVar5 == (SPIRExpression *)0x0) || ((pSVar5->access_chain & 1U) == 0)) {
    return false;
  }
  uVar2 = Compiler::get_decoration((Compiler *)this,(ID)(pSVar5->loaded_from).id,DecorationBuiltIn);
  if ((uVar2 != 0xc) && (uVar2 != 0xb)) {
    return false;
  }
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::operator[]
                      (&(pSVar5->implied_read_expressions).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>,1);
  uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
  this_01 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar3);
  if (this_01 == (SPIRConstant *)0x0) {
    return false;
  }
  if ((uVar2 == 0xc) && (uVar3 = SPIRConstant::scalar(this_01,0,0), uVar3 == 1)) {
    return true;
  }
  local_42 = false;
  if (uVar2 == 0xb) {
    uVar2 = SPIRConstant::scalar(this_01,0,0);
    local_42 = uVar2 == 3;
  }
  return local_42;
}

Assistant:

bool CompilerMSL::is_out_of_bounds_tessellation_level(uint32_t id_lhs)
{
	if (!get_entry_point().flags.get(ExecutionModeTriangles))
		return false;

	// In SPIR-V, TessLevelInner always has two elements and TessLevelOuter always has
	// four. This is true even if we are tessellating triangles. This allows clients
	// to use a single tessellation control shader with multiple tessellation evaluation
	// shaders.
	// In Metal, however, only the first element of TessLevelInner and the first three
	// of TessLevelOuter are accessible. This stems from how in Metal, the tessellation
	// levels must be stored to a dedicated buffer in a particular format that depends
	// on the patch type. Therefore, in Triangles mode, any access to the second
	// inner level or the fourth outer level must be dropped.
	const auto *e = maybe_get<SPIRExpression>(id_lhs);
	if (!e || !e->access_chain)
		return false;
	BuiltIn builtin = BuiltIn(get_decoration(e->loaded_from, DecorationBuiltIn));
	if (builtin != BuiltInTessLevelInner && builtin != BuiltInTessLevelOuter)
		return false;
	auto *c = maybe_get<SPIRConstant>(e->implied_read_expressions[1]);
	if (!c)
		return false;
	return (builtin == BuiltInTessLevelInner && c->scalar() == 1) ||
	       (builtin == BuiltInTessLevelOuter && c->scalar() == 3);
}